

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O0

double despot::State::Weight(vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  size_type sVar1;
  const_reference ppSVar2;
  int local_1c;
  double dStack_18;
  int i;
  double weight;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  
  dStack_18 = 0.0;
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar1 <= (ulong)(long)local_1c) break;
    ppSVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)local_1c);
    dStack_18 = (*ppSVar2)->weight + dStack_18;
    local_1c = local_1c + 1;
  }
  return dStack_18;
}

Assistant:

double State::Weight(const vector<State*>& particles) {
	double weight = 0;
	for (int i = 0; i < particles.size(); i++)
		weight += particles[i]->weight;
	return weight;
}